

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O3

Abc_Cex_t *
Saig_ManFindCexCareBits(Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,int fNewOrder,int fVerbose)

{
  Abc_Cex_t *p;
  int iVar1;
  Saig_RefMan_t *p_00;
  Aig_Man_t *p_01;
  Vec_Int_t *vReasons;
  Vec_Int_t *__ptr;
  Abc_Cex_t *p_02;
  long lVar2;
  long lVar3;
  int level;
  timespec ts;
  timespec local_48;
  Abc_Cex_t *local_38;
  
  clock_gettime(3,&local_48);
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  p_00 = (Saig_RefMan_t *)calloc(1,0x28);
  p_00->pAig = pAig;
  p_00->pCex = pCex;
  p_00->nInputs = nInputs;
  p_00->fVerbose = fVerbose;
  local_38 = pCex;
  p_01 = Saig_ManUnrollWithCex(pAig,pCex,nInputs,&p_00->vMapPiF2A);
  p_00->pFrames = p_01;
  vReasons = Saig_RefManFindReason(p_00);
  if (fVerbose != 0) {
    Aig_ManPrintStats(p_01);
  }
  __ptr = Saig_RefManReason2Inputs(p_00,vReasons);
  iVar1 = 0x8ff7c9;
  printf("Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
         (ulong)(uint)p_01->nObjs[2],(ulong)(uint)vReasons->nSize,
         (ulong)(uint)(p_00->pAig->nTruePis - p_00->nInputs),(ulong)(uint)__ptr->nSize);
  Abc_Print(iVar1,"%s =","Time");
  level = 3;
  iVar1 = clock_gettime(3,&local_48);
  p = local_38;
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  p_02 = Saig_RefManReason2Cex(p_00,vReasons);
  if (vReasons->pArray != (int *)0x0) {
    free(vReasons->pArray);
  }
  free(vReasons);
  Saig_RefManStop(p_00);
  if (fVerbose != 0) {
    Abc_CexPrintStats(p);
    Abc_CexPrintStats(p_02);
  }
  return p_02;
}

Assistant:

Abc_Cex_t * Saig_ManFindCexCareBits( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, int fNewOrder, int fVerbose )
{
    Saig_RefMan_t * p;
    Vec_Int_t * vReasons;
    Abc_Cex_t * pCare;
    abctime clk = Abc_Clock();

    clk = Abc_Clock();
    p = Saig_RefManStart( pAig, pCex, nInputs, fVerbose );
    vReasons = Saig_RefManFindReason( p );

if ( fVerbose )
Aig_ManPrintStats( p->pFrames );

//    if ( fVerbose )
    {
        Vec_Int_t * vRes = Saig_RefManReason2Inputs( p, vReasons );
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );
ABC_PRT( "Time", Abc_Clock() - clk );

        Vec_IntFree( vRes );

/*
        ////////////////////////////////////
        Vec_IntFree( vReasons );
        vReasons = Saig_RefManRefineWithSat( p, vRes );
        ////////////////////////////////////

        Vec_IntFree( vRes );
        vRes = Saig_RefManReason2Inputs( p, vReasons );
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );

        Vec_IntFree( vRes );
ABC_PRT( "Time", Abc_Clock() - clk );
*/
    }

    pCare = Saig_RefManReason2Cex( p, vReasons );
    Vec_IntFree( vReasons );
    Saig_RefManStop( p );

if ( fVerbose )
Abc_CexPrintStats( pCex );
if ( fVerbose )
Abc_CexPrintStats( pCare );

    return pCare;
}